

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

field_metrics FIX::FieldBase::calculateMetrics(const_iterator start,const_iterator end)

{
  const_iterator str;
  const_iterator cVar1;
  ulong uVar2;
  field_metrics fVar3;
  
  uVar2 = 0;
  for (cVar1._M_current = start._M_current; cVar1._M_current != end._M_current;
      cVar1._M_current = cVar1._M_current + 1) {
    uVar2 = (ulong)((int)uVar2 + (uint)(byte)*cVar1._M_current);
  }
  fVar3.m_length = (long)end._M_current - (long)start._M_current;
  fVar3._8_8_ = uVar2;
  return fVar3;
}

Assistant:

static field_metrics calculateMetrics( 
    std::string::const_iterator const start,
    std::string::const_iterator const end )
  {
    int checksum = 0;
    for ( std::string::const_iterator str = start; str != end; ++str )
      checksum += (unsigned char)( *str );

#if defined(__SUNPRO_CC)
    std::ptrdiff_t d;
    std::distance(start, end, d);
    return field_metrics( d, checksum );
#else
    return field_metrics( std::distance( start, end ), checksum );
#endif
  }